

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerInvalidRate_Test::TestBody
          (Sampler_testProbabilisticSamplerInvalidRate_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  duration dVar3;
  char cVar4;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  Config samplerConfig2;
  Config samplerConfig1;
  AssertHelper local_140 [8];
  string local_138;
  duration local_118 [2];
  undefined1 local_108 [8];
  undefined1 local_100 [32];
  Config local_e0;
  Config local_88;
  
  paVar1 = &local_e0._type.field_2;
  local_e0._type._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"probabilistic","");
  paVar2 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  local_100._0_8_ = (pointer)0x0;
  Config::Config(&local_88,&local_e0._type,1.1,&local_138,0,(duration *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._type._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._type._M_dataplus._M_p);
  }
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"probabilistic","");
  local_100._0_8_ = (Metrics *)(local_100 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"","");
  local_118[0].__r = 0;
  Config::Config(&local_e0,&local_138,-0.1,(string *)local_100,0,local_118);
  if ((Metrics *)local_100._0_8_ != (Metrics *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  cVar4 = testing::internal::AlwaysTrue();
  if (cVar4 != '\0') {
    local_138._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"test-service","");
    Config::makeSampler((Config *)local_108,&local_88._type,(Logger *)&local_138,
                        (Metrics *)local_100._0_8_);
    if (local_108 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
    local_108 = (undefined1  [8])0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_138);
  testing::internal::AssertHelper::AssertHelper
            (local_140,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
             ,0xac,
             "Expected: samplerConfig1.makeSampler(\"test-service\", *logger, *metrics) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
  testing::internal::AssertHelper::~AssertHelper(local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    cVar4 = testing::internal::IsTrue(true);
    if ((cVar4 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
  }
  dVar3.__r = local_118[0].__r;
  if ((Metrics *)local_118[0].__r != (Metrics *)0x0) {
    jaegertracing::metrics::Metrics::~Metrics((Metrics *)local_118[0].__r);
    operator_delete((void *)dVar3.__r);
  }
  if ((Metrics *)local_100._0_8_ != (Metrics *)0x0) {
    (**(code **)(*(long *)local_100._0_8_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._samplingServerURL._M_dataplus._M_p != &local_e0._samplingServerURL.field_2) {
    operator_delete(local_e0._samplingServerURL._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._type._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._samplingServerURL._M_dataplus._M_p != &local_88._samplingServerURL.field_2) {
    operator_delete(local_88._samplingServerURL._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._type._M_dataplus._M_p != &local_88._type.field_2) {
    operator_delete(local_88._type._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Sampler, testGuaranteedThroughputProbabilisticSamplerUpdate)
{
    auto lowerBound = 2.0;
    auto samplingRate = 0.5;
    GuaranteedThroughputProbabilisticSampler sampler(lowerBound, samplingRate);
    ASSERT_EQ(lowerBound, sampler.lowerBound());
    ASSERT_EQ(samplingRate, sampler.samplingRate());

    auto newLowerBound = 1.0;
    auto newSamplingRate = 0.6;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(newLowerBound, sampler.lowerBound());
    ASSERT_EQ(newSamplingRate, sampler.samplingRate());

    newSamplingRate = 1.1;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(1.0, sampler.samplingRate());
}